

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::UsubBorrowCase::compare(UsubBorrowCase *this,void **inputs,void **outputs)

{
  uint uVar1;
  DataType dataType;
  Precision precision_00;
  int iVar2;
  int integerLength_00;
  deUint32 dVar3;
  uint value;
  uint uVar4;
  reference pvVar5;
  ostream *poVar6;
  Hex<8UL> HVar7;
  deUint32 ref1;
  deUint32 ref0;
  deUint32 out1;
  deUint32 out0;
  deUint32 in1;
  deUint32 in0;
  int compNdx;
  deUint32 mask0;
  int integerLength;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  UsubBorrowCase *this_local;
  
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar5->varType);
  pvVar5 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  precision_00 = glu::VarType::getPrecision(&pvVar5->varType);
  iVar2 = glu::getDataTypeScalarSize(dataType);
  integerLength_00 =
       anon_unknown_3::getShaderUintBitCount
                 ((this->super_IntegerFunctionCase).m_shaderType,precision_00);
  dVar3 = anon_unknown_3::getLowBitMask(integerLength_00);
  in1 = 0;
  while( true ) {
    if (iVar2 <= (int)in1) {
      return true;
    }
    uVar4 = *(uint *)((long)*inputs + (long)(int)in1 * 4);
    uVar1 = *(uint *)((long)inputs[1] + (long)(int)in1 * 4);
    value = uVar4 - uVar1;
    uVar4 = (uint)(uVar4 < uVar1);
    if (((*(uint *)((long)*outputs + (long)(int)in1 * 4) & dVar3) != (value & dVar3)) ||
       (*(uint *)((long)outputs[1] + (long)(int)in1 * 4) != uVar4)) break;
    in1 = in1 + 1;
  }
  poVar6 = std::operator<<((ostream *)&(this->super_IntegerFunctionCase).m_failMsg,"Expected [");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,in1);
  poVar6 = std::operator<<(poVar6,"] = ");
  HVar7 = tcu::toHex<unsigned_int>(value);
  poVar6 = tcu::Format::operator<<(poVar6,HVar7);
  poVar6 = std::operator<<(poVar6,", ");
  HVar7 = tcu::toHex<unsigned_int>(uVar4);
  tcu::Format::operator<<(poVar6,HVar7);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask0			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint32	ref0	= in0-in1;
			const deUint32	ref1	= in0 >= in1 ? 0u : 1u;

			if (((out0&mask0) != (ref0&mask0)) || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}